

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>::fulfill
          (AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *this,
          unsigned_long *value)

{
  ExceptionOr<unsigned_long> local_178;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_178.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_178.value.ptr.isSet = true;
    local_178.value.ptr.field_1.value = *value;
    ExceptionOr<unsigned_long>::operator=(&this->result,&local_178);
    if (local_178.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_178.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }